

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall
google::protobuf::DescriptorProto_ExtensionRange::ByteSize(DescriptorProto_ExtensionRange *this)

{
  byte bVar1;
  uint value;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar3 = (uint)bVar1;
  iVar4 = 0;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      value = this->start_;
      if ((int)value < 0) {
        iVar4 = 0xb;
      }
      else {
        iVar4 = 2;
        if (0x7f < value) {
          iVar4 = io::CodedOutputStream::VarintSize32Fallback(value);
          iVar4 = iVar4 + 1;
          uVar3 = this->_has_bits_[0];
        }
      }
    }
    if ((uVar3 & 2) != 0) {
      uVar3 = this->end_;
      if ((int)uVar3 < 0) {
        iVar5 = 0xb;
      }
      else {
        iVar5 = 2;
        if (0x7f < uVar3) {
          iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar3);
          iVar5 = iVar5 + 1;
        }
      }
      iVar4 = iVar4 + iVar5;
    }
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar5 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar4 + iVar5;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int DescriptorProto_ExtensionRange::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional int32 start = 1;
    if (has_start()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->start());
    }

    // optional int32 end = 2;
    if (has_end()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->end());
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}